

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall google::protobuf::MethodDescriptorProto::SharedDtor(MethodDescriptorProto *this)

{
  MethodDescriptorProto *pMVar1;
  MethodDescriptorProto *in_RDI;
  string *default_value;
  ArenaStringPtr *in_stack_ffffffffffffff80;
  ArenaStringPtr *this_00;
  
  default_value = (string *)&in_RDI->name_;
  internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  internal::ArenaStringPtr::DestroyNoArena(in_stack_ffffffffffffff80,default_value);
  this_00 = &in_RDI->input_type_;
  internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  internal::ArenaStringPtr::DestroyNoArena(this_00,default_value);
  internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  internal::ArenaStringPtr::DestroyNoArena(this_00,default_value);
  pMVar1 = internal_default_instance();
  if ((in_RDI != pMVar1) && (in_RDI->options_ != (MethodOptions *)0x0)) {
    (*(in_RDI->options_->super_Message).super_MessageLite._vptr_MessageLite[1])();
  }
  return;
}

Assistant:

void MethodDescriptorProto::SharedDtor() {
  GOOGLE_DCHECK(GetArenaNoVirtual() == nullptr);
  name_.DestroyNoArena(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  input_type_.DestroyNoArena(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  output_type_.DestroyNoArena(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (this != internal_default_instance()) delete options_;
}